

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_StartScript(FParser *this)

{
  TObjPtr<DFraggleThinker> this_00;
  uint uVar1;
  DRunningScript *this_01;
  long lVar2;
  AActor *trigger;
  DFsScript *owner;
  
  if (this->t_argc != 1) {
    script_error("incorrect arguments to function\n");
    return;
  }
  uVar1 = intvalue(this->t_argv);
  this_00 = DFraggleThinker::ActiveThinker;
  if (0x100 < uVar1) {
    script_error("script number %d out of range\n",(ulong)uVar1);
    return;
  }
  if (DFraggleThinker::ActiveThinker.field_0 == (DFraggleThinker *)0x0) {
    return;
  }
  if ((*(byte *)((long)DFraggleThinker::ActiveThinker.field_0 + 0x20) & 0x20) != 0) {
    DFraggleThinker::ActiveThinker = (TObjPtr<DFraggleThinker>)0x0;
    return;
  }
  lVar2 = *(long *)((long)DFraggleThinker::ActiveThinker.field_0 + 0x38);
  if (lVar2 == 0) {
LAB_006ad2b5:
    lVar2 = 0;
  }
  else if ((*(byte *)(lVar2 + 0x20) & 0x20) != 0) {
    *(undefined8 *)((long)DFraggleThinker::ActiveThinker.field_0 + 0x38) = 0;
    goto LAB_006ad2b5;
  }
  owner = *(DFsScript **)(lVar2 + 0x148 + (ulong)uVar1 * 8);
  if (owner == (DFsScript *)0x0) {
LAB_006ad2d9:
    owner = (DFsScript *)0x0;
    script_error("script %i not defined\n",(ulong)uVar1);
  }
  else if (((owner->super_DObject).ObjectFlags & 0x20) != 0) {
    *(undefined8 *)(lVar2 + 0x148 + (ulong)uVar1 * 8) = 0;
    goto LAB_006ad2d9;
  }
  this_01 = (DRunningScript *)
            M_Malloc_Dbg(0xd8,
                         "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                         ,0x1f7);
  trigger = (this->Script->trigger).field_0.p;
  if (trigger != (AActor *)0x0) {
    if (((trigger->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_006ad32b;
    (this->Script->trigger).field_0.p = (AActor *)0x0;
  }
  trigger = (AActor *)0x0;
LAB_006ad32b:
  DRunningScript::DRunningScript(this_01,trigger,owner,0);
  DFraggleThinker::AddRunningScript((DFraggleThinker *)this_00.field_0,this_01);
  return;
}

Assistant:

void FParser::SF_StartScript()
{
	if(t_argc != 1)
	{
		script_error("incorrect arguments to function\n");
		return;
	}
	
	int snum = intvalue(t_argv[0]);

	if(snum < 0 || snum >= MAXSCRIPTS)
	{
		script_error("script number %d out of range\n",snum);
		return;
	}

	DFraggleThinker *th = DFraggleThinker::ActiveThinker;
	if (th)
	{

		DFsScript *script = th->LevelScript->children[snum];
	
		if(!script)
		{
			script_error("script %i not defined\n", snum);
		}
		
		DRunningScript *runscr = new DRunningScript(Script->trigger, script, 0);
		// hook into chain at start
		th->AddRunningScript(runscr);
	}
}